

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ws_handshake.c
# Opt level: O1

int nn_ws_match_token(char *token,char **subj,int case_insensitive,int ignore_leading_sp)

{
  char cVar1;
  char *pcVar2;
  int iVar3;
  __int32_t **pp_Var4;
  size_t sVar5;
  int extraout_EDX;
  undefined4 extraout_EDX_00;
  undefined4 extraout_var;
  char cVar6;
  char **ppcVar7;
  undefined8 *in_R8;
  long *in_R9;
  long lVar8;
  char *pcVar9;
  char *pcVar10;
  
  if ((token != (char *)0x0) && (pcVar10 = *subj, pcVar10 != (char *)0x0)) {
    cVar6 = *token;
    ppcVar7 = subj;
    pcVar9 = token;
    if (case_insensitive == 0) {
      for (; (cVar6 != '\0' && (*pcVar10 != '\0')); pcVar10 = pcVar10 + 1) {
        if (cVar6 != *pcVar10) goto LAB_001317ab;
        cVar6 = pcVar9[1];
        pcVar9 = pcVar9 + 1;
      }
    }
    else {
      for (; (cVar6 != '\0' && (cVar1 = *pcVar10, (long)cVar1 != 0)); pcVar10 = pcVar10 + 1) {
        pp_Var4 = __ctype_tolower_loc();
        ignore_leading_sp = (*pp_Var4)[cVar6];
        if (ignore_leading_sp != (*pp_Var4)[cVar1]) goto LAB_001317ab;
        cVar6 = pcVar9[1];
        pcVar9 = pcVar9 + 1;
      }
    }
    if ((*pcVar10 == '\0') && (*pcVar9 != '\0')) {
LAB_001317ab:
      iVar3 = 0;
    }
    else {
      if (*pcVar9 != '\0') goto LAB_001317bb;
      *subj = pcVar10;
      iVar3 = 1;
    }
    return iVar3;
  }
  nn_ws_match_token_cold_2();
  ppcVar7 = subj;
LAB_001317bb:
  nn_ws_match_token_cold_1();
  if ((token == (char *)0x0) || (pcVar10 = *ppcVar7, pcVar10 == (char *)0x0)) {
    nn_ws_match_value_cold_1();
    sVar5 = strlen(token);
    if (sVar5 == CONCAT44(extraout_var,extraout_EDX_00)) {
      cVar6 = *token;
      iVar3 = 1;
      if (cVar6 != '\0') {
        lVar8 = 0;
        do {
          cVar1 = *(char *)((long)ppcVar7 + lVar8);
          if ((long)cVar1 == 0) {
            return 1;
          }
          pp_Var4 = __ctype_tolower_loc();
          if ((*pp_Var4)[cVar6] != (*pp_Var4)[cVar1]) goto LAB_001318ff;
          cVar6 = token[lVar8 + 1];
          lVar8 = lVar8 + 1;
        } while (cVar6 != '\0');
      }
    }
    else {
LAB_001318ff:
      iVar3 = 0;
    }
    return iVar3;
  }
  if (in_R8 != (undefined8 *)0x0) {
    *in_R8 = 0;
  }
  if (in_R9 != (long *)0x0) {
    *in_R9 = 0;
  }
  pcVar9 = strstr(pcVar10,token);
  if (pcVar9 == (char *)0x0) {
    iVar3 = 0;
  }
  else {
    sVar5 = strlen(token);
    *ppcVar7 = pcVar9 + sVar5;
    pcVar2 = pcVar10;
    if (extraout_EDX != 0) {
      do {
        pcVar10 = pcVar2;
        if (pcVar9 <= pcVar10) break;
        pcVar2 = pcVar10 + 1;
      } while (*pcVar10 == ' ');
    }
    if (in_R8 != (undefined8 *)0x0) {
      *in_R8 = pcVar10;
    }
    iVar3 = 1;
    if (pcVar10 != pcVar9) {
      pcVar2 = pcVar9;
      if (ignore_leading_sp != 0) {
        do {
          pcVar9 = pcVar2;
          if (pcVar9 <= pcVar10) break;
          pcVar2 = pcVar9 + -1;
        } while (pcVar9[-1] == ' ');
      }
      if (in_R9 != (long *)0x0) {
        *in_R9 = (long)pcVar9 - (long)pcVar10;
      }
    }
  }
  return iVar3;
}

Assistant:

static int nn_ws_match_token (const char* token, const char **subj,
    int case_insensitive, int ignore_leading_sp)
{
    const char *pos;

    nn_assert (token && *subj);

    pos = *subj;

    if (ignore_leading_sp) {
        while (*pos == '\x20' && *pos) {
            pos++;
        }
    }

    if (case_insensitive) {
        while (*token && *pos) {
            if (tolower (*token) != tolower (*pos))
                return NN_WS_HANDSHAKE_NOMATCH;
            token++;
            pos++;
        }
    }
    else {
        while (*token && *pos) {
            if (*token != *pos)
                return NN_WS_HANDSHAKE_NOMATCH;
            token++;
            pos++;
        }
    }

    /*  Encountered end of subject before matching completed. */
    if (!*pos && *token)
        return NN_WS_HANDSHAKE_NOMATCH;

    /*  Entire token has been matched. */
    nn_assert (!*token);

    /*  On success, advance subject position. */
    *subj = pos;

    return NN_WS_HANDSHAKE_MATCH;
}